

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

ngx_int_t ngx_strncasecmp(u_char *s1,u_char *s2,size_t n)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  sVar3 = 0;
  while( true ) {
    if (n == sVar3) {
      return 0;
    }
    bVar1 = s1[sVar3];
    bVar2 = s2[sVar3];
    uVar4 = (ulong)bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      uVar4 = (ulong)bVar1;
    }
    uVar5 = (ulong)bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      uVar5 = (ulong)bVar2;
    }
    if (uVar4 - uVar5 != 0) break;
    sVar3 = sVar3 + 1;
    if (uVar4 == 0) {
      return 0;
    }
  }
  return uVar4 - uVar5;
}

Assistant:

ngx_int_t
ngx_strncasecmp(u_char *s1, u_char *s2, size_t n)
{
    ngx_uint_t  c1, c2;

    while (n) {
        c1 = (ngx_uint_t) *s1++;
        c2 = (ngx_uint_t) *s2++;

        c1 = (c1 >= 'A' && c1 <= 'Z') ? (c1 | 0x20) : c1;
        c2 = (c2 >= 'A' && c2 <= 'Z') ? (c2 | 0x20) : c2;

        if (c1 == c2) {

            if (c1) {
                n--;
                continue;
            }

            return 0;
        }

        return c1 - c2;
    }

    return 0;
}